

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTranslate.cpp
# Opt level: O2

void PrintEscapedName(ExpressionTranslateContext *ctx,InplaceStr name)

{
  uint uVar1;
  uint i;
  ulong uVar2;
  
  for (uVar2 = 0; (uint)((int)name.end - (int)name.begin) != uVar2; uVar2 = uVar2 + 1) {
    uVar1 = (byte)name.begin[uVar2] - 0x20;
    if ((uVar1 < 0x3e) && ((0x2800000054005311U >> ((ulong)uVar1 & 0x3f) & 1) != 0)) {
      OutputContext::Print(ctx->output,"_");
    }
    else {
      OutputContext::Print(ctx->output,name.begin[uVar2]);
    }
  }
  return;
}

Assistant:

void PrintEscapedName(ExpressionTranslateContext &ctx, InplaceStr name)
{
	for(unsigned i = 0; i < name.length(); i++)
	{
		char ch = name.begin[i];

		if(ch == ' ' || ch == '[' || ch == ']' || ch == '(' || ch == ')' || ch == ',' || ch == ':' || ch == '$' || ch == '<' || ch == '>' || ch == '.')
			ctx.output.Print("_");
		else
			ctx.output.Print(ch);
	}
}